

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::(anonymous_namespace)::EncodeDecodeTest_EncodeDeterministicOutput_Test::
~EncodeDecodeTest_EncodeDeterministicOutput_Test
          (EncodeDecodeTest_EncodeDeterministicOutput_Test *this)

{
  *(undefined ***)(this + -0x10) = &PTR__EncodeDecodeTest_018ce1d0;
  *(undefined ***)this = &PTR__EncodeDecodeTest_018ce210;
  if (*(EncodeDecodeTest_EncodeDeterministicOutput_Test **)(this + 0x80) != this + 0x90) {
    operator_delete(*(EncodeDecodeTest_EncodeDeterministicOutput_Test **)(this + 0x80),
                    *(long *)(this + 0x90) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(this + 0x68));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(this + 0x50));
  if (*(EncodeDecodeTest_EncodeDeterministicOutput_Test **)(this + 0x30) != this + 0x40) {
    operator_delete(*(EncodeDecodeTest_EncodeDeterministicOutput_Test **)(this + 0x30),
                    *(long *)(this + 0x40) + 1);
  }
  if (*(EncodeDecodeTest_EncodeDeterministicOutput_Test **)(this + 0x10) != this + 0x20) {
    operator_delete(*(EncodeDecodeTest_EncodeDeterministicOutput_Test **)(this + 0x10),
                    *(long *)(this + 0x20) + 1);
  }
  testing::Test::~Test((Test *)(this + -0x10));
  operator_delete((Test *)(this + -0x10),0xb0);
  return;
}

Assistant:

TEST_P(EncodeDecodeTest, EncodeDeterministicOutput) {
  std::string golden_path = absl::StrCat(TestTempDir(), "/golden_message");
  WriteGoldenMessage(golden_path);
  RedirectStdinFromFile(TestUtil::GetTestDataPath(
      "google/protobuf/"
      "testdata/text_format_unittest_data_oneof_implemented.txt"));
  std::string args;
  if (GetParam() != DESCRIPTOR_SET_IN) {
    args.append("google/protobuf/unittest.proto");
  }
  EXPECT_TRUE(Run(absl::StrCat(
      args, " --encode=proto2_unittest.TestAllTypes --deterministic_output")));
  ExpectStdoutMatchesBinaryFile(golden_path);
  ExpectNoErrors();
}